

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolTests.cpp
# Opt level: O3

void vkt::QueryPool::anon_unknown_1::createChildren(TestCaseGroup *queryPoolTests)

{
  TestContext *testCtx;
  TestNode *pTVar1;
  
  testCtx = (queryPoolTests->super_TestNode).m_testCtx;
  pTVar1 = (TestNode *)operator_new(0x70);
  QueryPoolOcclusionTests::QueryPoolOcclusionTests((QueryPoolOcclusionTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&queryPoolTests->super_TestNode,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  QueryPoolStatisticsTests::QueryPoolStatisticsTests((QueryPoolStatisticsTests *)pTVar1,testCtx);
  tcu::TestNode::addChild(&queryPoolTests->super_TestNode,pTVar1);
  return;
}

Assistant:

void createChildren (tcu::TestCaseGroup* queryPoolTests)
{
	tcu::TestContext&	testCtx		= queryPoolTests->getTestContext();

	queryPoolTests->addChild(new QueryPoolOcclusionTests(testCtx));
	queryPoolTests->addChild(new QueryPoolStatisticsTests(testCtx));
}